

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_j.c
# Opt level: O1

void test_option_j(void)

{
  wchar_t wVar1;
  wchar_t wVar2;
  char *pcVar3;
  size_t s;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_j.c"
                      ,L'$',"f",L'Ƥ',L'\xffffffff',"a");
  wVar1 = systemf("%s -jcf archive.out f 2>archive.err",testprog);
  pcVar3 = slurpfile(&s,"archive.err");
  pcVar3[s] = '\0';
  if (wVar1 == L'\0') {
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_j.c"
               ,L'3',"archive.err");
    pcVar3 = slurpfile(&s,"archive.out");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_j.c"
                     ,L'6',(uint)(2 < s),"s > 2",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_j.c"
                        ,L'7',pcVar3,"p","BZh9","\"BZh9\"",4,"4",(void *)0x0);
  }
  else {
    wVar2 = canBzip2();
    if (wVar2 == L'\0') {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_j.c"
                     ,L',');
      test_skipping("bzip2 is not supported on this platform");
    }
    else {
      failure("-j option is broken");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_option_j.c"
                          ,L'0',(long)wVar1,"r",0,"0",(void *)0x0);
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_option_j)
{
	char *p;
	int r;
	size_t s;

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Archive it with bzip2 compression. */
	r = systemf("%s -jcf archive.out f 2>archive.err", testprog);
	p = slurpfile(&s, "archive.err");
	p[s] = '\0';
	if (r != 0) {
		if (!canBzip2()) {
			skipping("bzip2 is not supported on this platform");
			return;
		}
		failure("-j option is broken");
		assertEqualInt(r, 0);
		return;
	}
	assertEmptyFile("archive.err");
	/* Check that the archive file has a bzip2 signature. */
	p = slurpfile(&s, "archive.out");
	assert(s > 2);
	assertEqualMem(p, "BZh9", 4);
}